

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_bms.cpp
# Opt level: O1

double __thiscall BmsBms::GetEndTime(BmsBms *this)

{
  _Rb_tree_header *p_Var1;
  barindex bVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr local_18;
  
  p_Var3 = (this->time_manager_).array_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->time_manager_).array_._M_t._M_impl.super__Rb_tree_header;
  local_18 = (_Base_ptr)0x0;
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    local_18 = (_Base_ptr)0x0;
  }
  else {
    do {
      p_Var4 = p_Var3[1]._M_parent;
      if ((double)p_Var3[1]._M_parent <= (double)local_18) {
        p_Var4 = local_18;
      }
      local_18 = p_Var4;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  bVar2 = BmsChannelManager::GetObjectExistsMaxPosition
                    (&this->channel_manager_,(BmsChannelConditionJudgeFunction)BmsChannel::IsChannel
                    );
  p_Var4 = (_Base_ptr)BmsTimeManager::GetTimeFromBar(&this->time_manager_,(double)bVar2);
  if ((double)p_Var4 <= (double)local_18) {
    p_Var4 = local_18;
  }
  return (double)p_Var4;
}

Assistant:

double BmsBms::GetEndTime() {
	double t = 0;
	for (auto it = time_manager_.Begin(); it != time_manager_.End(); ++it) {
		t = std::max(t, it->second.time);
	}
	barindex lastbar = GetObjectExistsMaxBar();
	return std::max(t, time_manager_.GetTimeFromBar(lastbar));
}